

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgbclll(fitsfile *fptr,int colnum,char *ttype,char *tunit,char *dtype,LONGLONG *repeat,
            double *tscal,double *tzero,LONGLONG *tnull,char *tdisp,int *status)

{
  tcolumn *ptVar1;
  char *value;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined2 uVar5;
  int tstatus;
  char name [75];
  int local_e4;
  char *local_e0;
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_e0 = tunit;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_0013e7a0;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar1 = fptr->Fptr->tableptr;
  if (ttype != (char *)0x0) {
    strcpy(ttype,ptVar1[(ulong)(uint)colnum - 1].ttype);
  }
  if (dtype != (char *)0x0) {
    if (ptVar1[(ulong)(uint)colnum - 1].tdatatype < 0) {
      dtype[0] = 'P';
      dtype[1] = '\0';
    }
    else {
      *dtype = '\0';
    }
    iVar2 = ptVar1[(ulong)(uint)colnum - 1].tdatatype;
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar3 < 0x29) {
      if (iVar3 < 0xe) {
        uVar5 = 0x58;
        if (iVar3 != 1) {
          if (iVar3 != 0xb) goto LAB_0013e6bb;
          uVar5 = 0x42;
        }
      }
      else if (iVar3 == 0xe) {
        uVar5 = 0x4c;
      }
      else if (iVar3 == 0x10) {
        uVar5 = 0x41;
      }
      else {
        if (iVar3 != 0x15) goto LAB_0013e6bb;
        uVar5 = 0x49;
      }
    }
    else if (iVar3 < 0x52) {
      if (iVar3 == 0x29) {
        uVar5 = 0x4a;
      }
      else if (iVar3 == 0x2a) {
        uVar5 = 0x45;
      }
      else {
        if (iVar3 != 0x51) goto LAB_0013e6bb;
        uVar5 = 0x4b;
      }
    }
    else if (iVar3 == 0x52) {
      uVar5 = 0x44;
    }
    else if (iVar3 == 0x53) {
      uVar5 = 0x43;
    }
    else {
      if (iVar3 != 0xa3) goto LAB_0013e6bb;
      uVar5 = 0x4d;
    }
    sVar4 = strlen(dtype);
    *(undefined2 *)(dtype + sVar4) = uVar5;
  }
LAB_0013e6bb:
  value = local_e0;
  if (repeat != (LONGLONG *)0x0) {
    *repeat = ptVar1[(ulong)(uint)colnum - 1].trepeat;
  }
  if (tscal != (double *)0x0) {
    *tscal = ptVar1[(ulong)(uint)colnum - 1].tscale;
  }
  if (tzero != (double *)0x0) {
    *tzero = ptVar1[(ulong)(uint)colnum - 1].tzero;
  }
  if (tnull != (LONGLONG *)0x0) {
    *tnull = ptVar1[(ulong)(uint)colnum - 1].tnull;
  }
  if (local_e0 != (char *)0x0) {
    ffkeyn("TUNIT",colnum,local_88,status);
    local_e4 = 0;
    *value = '\0';
    ffgkys(fptr,local_88,value,local_d8,&local_e4);
  }
  if (tdisp != (char *)0x0) {
    ffkeyn("TDISP",colnum,local_88,status);
    local_e4 = 0;
    *tdisp = '\0';
    ffgkys(fptr,local_88,tdisp,local_d8,&local_e4);
  }
LAB_0013e7a0:
  return *status;
}

Assistant:

int ffgbclll( fitsfile *fptr,   /* I - FITS file pointer                      */
            int  colnum,      /* I - column number                          */
            char *ttype,      /* O - TTYPEn keyword value                   */
            char *tunit,      /* O - TUNITn keyword value                   */
            char *dtype,      /* O - datatype char: I, J, E, D, etc.        */
            LONGLONG *repeat, /* O - vector column repeat count             */
            double *tscal,    /* O - TSCALn keyword value                   */
            double *tzero,    /* O - TZEROn keyword value                   */
            LONGLONG *tnull,  /* O - TNULLn keyword value integer cols only */
            char *tdisp,      /* O - TDISPn keyword value                   */
            int  *status)     /* IO - error status                          */
/*
  get BINTABLE column keyword values
*/
{
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr;
    int tstatus;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    /* get what we can from the column structure */

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum -1);     /* offset to correct column */

    if (ttype)
        strcpy(ttype, colptr->ttype);

    if (dtype)
    {
        if (colptr->tdatatype < 0)  /* add the "P" prefix for */
            strcpy(dtype, "P");     /* variable length columns */
        else
            dtype[0] = 0;

        if      (abs(colptr->tdatatype) == TBIT)
            strcat(dtype, "X");
        else if (abs(colptr->tdatatype) == TBYTE)
            strcat(dtype, "B");
        else if (abs(colptr->tdatatype) == TLOGICAL)
            strcat(dtype, "L");
        else if (abs(colptr->tdatatype) == TSTRING)
            strcat(dtype, "A");
        else if (abs(colptr->tdatatype) == TSHORT)
            strcat(dtype, "I");
        else if (abs(colptr->tdatatype) == TLONG)
            strcat(dtype, "J");
        else if (abs(colptr->tdatatype) == TLONGLONG)
            strcat(dtype, "K");
        else if (abs(colptr->tdatatype) == TFLOAT)
            strcat(dtype, "E");
        else if (abs(colptr->tdatatype) == TDOUBLE)
            strcat(dtype, "D");
        else if (abs(colptr->tdatatype) == TCOMPLEX)
            strcat(dtype, "C");
        else if (abs(colptr->tdatatype) == TDBLCOMPLEX)
            strcat(dtype, "M");
    }

    if (repeat)
        *repeat = colptr->trepeat;

    if (tscal)
        *tscal  = colptr->tscale;

    if (tzero)
        *tzero  = colptr->tzero;

    if (tnull)
        *tnull  = colptr->tnull;

    /* read keywords to get additional parameters */

    if (tunit)
    {
        ffkeyn("TUNIT", colnum, name, status);
        tstatus = 0;
        *tunit = '\0';
        ffgkys(fptr, name, tunit, comm, &tstatus);
    }

    if (tdisp)
    {
        ffkeyn("TDISP", colnum, name, status);
        tstatus = 0;
        *tdisp = '\0';
        ffgkys(fptr, name, tdisp, comm, &tstatus);
    }

    return(*status);
}